

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZTriangleTorus>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZTriangleTorus> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefPattern<pzgeom::TPZTriangleTorus> *cp)

{
  TPZVec<long> *in_RDI;
  TPZGeoElRefLess<pzgeom::TPZTriangleTorus> *in_stack_00000018;
  TPZGeoMesh *in_stack_00000020;
  void **in_stack_00000028;
  TPZGeoElRefLess<pzgeom::TPZTriangleTorus> *in_stack_00000030;
  TPZVec<long> *this_00;
  pointer_____offset_0x60___ *copy;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefPattern<pzgeom::TPZTriangleTorus>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  copy = &VTT;
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02460158);
  TPZGeoElRefLess<pzgeom::TPZTriangleTorus>::TPZGeoElRefLess
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZGeoElRefPattern_0245fe30;
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZGeoElRefPattern_0245fe30;
  this_00 = in_RDI + 0x14;
  TPZVec<long>::TPZVec(this_00);
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
            ((TPZAutoPointer<TPZRefPattern> *)this_00,
             (TPZAutoPointer<TPZRefPattern> *)(in_RDI + 0x15));
  TPZVec<long>::operator=(in_RDI,(TPZVec<long> *)copy);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZGeoMesh &DestMesh, const TPZGeoElRefPattern<TGeo> &cp):
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(DestMesh,cp),
fRefPattern(cp.fRefPattern) {

	this->fSubEl = cp.fSubEl;
}